

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O1

void __thiscall ftxui::Color::Color(Color *this,uint8_t red,uint8_t green,uint8_t blue)

{
  Color CVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int i;
  int iVar5;
  Palette256 index;
  int iVar7;
  ColorInfo CVar8;
  int iVar6;
  
  this->type_ = TrueColor;
  (this->field_1).index_ = red;
  this->green_ = green;
  this->blue_ = blue;
  CVar1 = Terminal::ColorSupport();
  if (CVar1 != TrueColor) {
    iVar5 = 0x10;
    iVar6 = 0;
    iVar7 = 0x30000;
    do {
      CVar8 = GetColorInfo((Palette256)iVar5);
      iVar2 = (CVar8._10_4_ & 0xff) - (uint)red;
      iVar3 = (CVar8._8_4_ >> 0x18) - (uint)green;
      iVar4 = (CVar8._12_4_ & 0xff) - (uint)blue;
      iVar2 = iVar4 * iVar4 + iVar3 * iVar3 + iVar2 * iVar2;
      if (iVar2 < iVar7) {
        iVar6 = iVar5;
      }
      index = (Palette256)iVar6;
      if (iVar7 < iVar2) {
        iVar2 = iVar7;
      }
      iVar7 = iVar2;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0x100);
    CVar1 = Terminal::ColorSupport();
    if (CVar1 == Palette256) {
      this->type_ = Palette256;
    }
    else {
      this->type_ = Palette16;
      CVar8 = GetColorInfo(index);
      index = CVar8.index_16;
    }
    (this->field_1).index_ = index;
  }
  return;
}

Assistant:

Color::Color(uint8_t red, uint8_t green, uint8_t blue)
    : type_(ColorType::TrueColor), red_(red), green_(green), blue_(blue) {
  if (Terminal::ColorSupport() == Terminal::Color::TrueColor)
    return;

  int closest = 256 * 256 * 3;
  int best = 0;
  for (int i = 16; i < 256; ++i) {
    ColorInfo color_info = GetColorInfo(Color::Palette256(i));
    int dr = color_info.red - red;
    int dg = color_info.green - green;
    int db = color_info.blue - blue;
    int dist = dr * dr + dg * dg + db * db;
    if (closest > dist) {
      closest = dist;
      best = i;
    }
  }

  if (Terminal::ColorSupport() == Terminal::Color::Palette256) {
    type_ = ColorType::Palette256;
    index_ = best;
  } else {
    type_ = ColorType::Palette16;
    index_ = GetColorInfo(Color::Palette256(best)).index_16;
  }
}